

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void expr_table(LexState *ls,ExpDesc *e)

{
  MSize MVar1;
  FuncState *fs;
  uint64_t uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BCPos BVar6;
  int iVar7;
  LexToken LVar8;
  BCReg BVar9;
  uint uVar10;
  ExpKind EVar11;
  GCstr *pGVar12;
  GCobj *gc;
  TValue *pTVar13;
  ushort uVar14;
  anon_union_8_3_2ce71dea_for_u aVar15;
  uint32_t hbits;
  uint32_t asize;
  long lVar16;
  uint uVar17;
  GCobj *o;
  uint uVar18;
  ExpDesc val;
  TValue k;
  cTValue local_80;
  uint uStack_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  BCLine local_68;
  BCReg local_64;
  BCInsLine *local_60;
  anon_union_8_3_2ce71dea_for_u local_58;
  uint local_50;
  int local_4c;
  int local_48;
  ulong local_40;
  cTValue local_38;
  
  fs = ls->fs;
  local_68 = ls->linenumber;
  BVar9 = fs->freereg;
  local_60 = (BCInsLine *)(ulong)(BVar9 * 0x100);
  BVar6 = bcemit_INS(fs,BVar9 * 0x100 + 0x34);
  e->k = VNONRELOC;
  (e->u).s.info = BVar9;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  uVar18 = 1;
  bcreg_reserve(fs,1);
  lex_check(ls,0x7b);
  iVar7 = ls->tok;
  if (iVar7 == 0x7d) {
    lex_match(ls,0x7d,0x7b,local_68);
    uVar18 = 1;
    gc = (GCobj *)0x0;
    bVar4 = false;
    bVar5 = false;
    uVar17 = 0;
  }
  else {
    local_64 = BVar9 + 1;
    local_40 = (ulong)BVar6;
    gc = (GCobj *)0x0;
    bVar4 = false;
    bVar5 = false;
    uVar17 = 0;
    do {
      if ((iVar7 == 0x11f) || (iVar7 == 0x10a)) {
        LVar8 = lj_lex_lookahead(ls);
        if (LVar8 == 0x3d) {
          uStack_78 = 3;
          uStack_74 = 0xffffffff;
          local_80.field_4.i = 0;
          uStack_70 = 0xffffffff;
          pGVar12 = lex_str(ls);
          local_80.field_4.i = (int32_t)pGVar12;
          local_80.field_4.it = (uint32_t)((ulong)pGVar12 >> 0x20);
          lex_check(ls,0x3d);
          uVar17 = uVar17 + 1;
          goto LAB_0012091d;
        }
LAB_00120921:
        uStack_78 = 4;
        uStack_74 = 0xffffffff;
        uStack_70 = 0xffffffff;
        local_80.n = (lua_Number)(int)uVar18;
        uVar18 = uVar18 + 1;
        bVar4 = true;
        bVar3 = true;
      }
      else {
        if (iVar7 != 0x5b) goto LAB_00120921;
        expr_bracket(ls,(ExpDesc *)&local_80.gcr);
        if (4 < uStack_78) {
          expr_index(fs,e,(ExpDesc *)&local_80.gcr);
        }
        if ((uStack_78 == 4) && (ABS((double)local_80.u64) == 0.0)) {
          bVar4 = true;
        }
        else {
          uVar17 = uVar17 + 1;
        }
        lex_check(ls,0x3d);
LAB_0012091d:
        bVar3 = false;
      }
      expr_binop(ls,(ExpDesc *)&local_58.s,0);
      if ((uStack_78 - 1 < 4) && ((uStack_78 == 3 || ((local_50 < 5 && (local_4c == local_48)))))) {
        if (gc == (GCobj *)0x0) {
          asize = uVar18;
          if (!bVar4) {
            asize = 0;
          }
          uVar10 = 0x1f;
          if (uVar17 - 1 != 0) {
            for (; uVar17 - 1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          hbits = (uVar10 ^ 0xffffffe0) + 0x21;
          if (uVar17 < 2) {
            hbits = uVar17;
          }
          gc = (GCobj *)lj_tab_new(fs->L,asize,hbits);
          BVar9 = const_gc(fs,gc,0xfffffff4);
          fs->bcbase[local_40].ins = BVar9 << 0x10 | (uint)local_60 | 0x35;
        }
        if (uStack_78 < 3) {
          local_38.u64 = ~((ulong)uStack_78 << 0x2f);
        }
        else {
          local_38 = local_80;
          if (uStack_78 == 3) {
            local_38.u64 = local_80.u64 | 0xfffd800000000000;
          }
        }
        pTVar13 = lj_tab_set(fs->L,&gc->tab,&local_38);
        if (((gc->gch).marked & 4) != 0) {
          uVar2 = (fs->L->glref).ptr64;
          (gc->gch).marked = (gc->gch).marked & 0xfb;
          (gc->gch).gclist.gcptr64 = *(uint64_t *)(uVar2 + 0x40);
          *(GCobj **)(uVar2 + 0x40) = gc;
        }
        if ((4 < (ulong)local_50) || (local_4c != local_48)) {
          pTVar13->u64 = (ulong)gc | 0xfffa000000000000;
          bVar3 = false;
          bVar5 = true;
          goto LAB_00120a92;
        }
        if (local_50 < 3) {
          aVar15.sval = (GCstr *)~((ulong)local_50 << 0x2f);
        }
        else {
          aVar15 = local_58;
          if (local_50 == 3) {
            aVar15.s = local_58.s | 0xfffd800000000000;
          }
        }
        pTVar13->u64 = (uint64_t)aVar15;
        bVar3 = true;
      }
      else {
LAB_00120a92:
        if (local_50 != 0xd) {
          expr_toanyreg(fs,(ExpDesc *)&local_58.s);
          bVar3 = false;
        }
        if (uStack_78 < 5) {
          expr_index(fs,e,(ExpDesc *)&local_80.gcr);
        }
        bcemit_store(fs,e,(ExpDesc *)&local_58.s);
        bVar3 = !bVar3;
      }
      fs->freereg = local_64;
      if ((ls->tok != 0x2c) && (ls->tok != 0x3b)) break;
      lj_lex_next(ls);
      iVar7 = ls->tok;
    } while (iVar7 != 0x7d);
    lex_match(ls,0x7d,0x7b,local_68);
    if (!bVar3) {
      uVar10 = fs->pc - 1;
      local_60 = fs->bcbase + uVar10;
      local_80.field_4.i = uVar18 - 1;
      local_80.field_4.it = 0x43300000;
      uStack_78 = 4;
      uStack_74 = 0xffffffff;
      uStack_70 = 0xffffffff;
      if (0x100 < uVar18) {
        fs->pc = uVar10;
        local_60 = local_60 + -1;
      }
      uVar10 = local_64 << 8;
      BVar9 = const_num(fs,(ExpDesc *)&local_80.gcr);
      local_60->ins = BVar9 << 0x10 | uVar10 | 0x3f;
      *(undefined1 *)((long)&local_60[-1].ins + 3) = 0;
    }
  }
  EVar11 = VNONRELOC;
  if (BVar6 == fs->pc - 1) {
    (e->u).s.info = BVar6;
    fs->freereg = fs->freereg - 1;
    EVar11 = VRELOCABLE;
  }
  e->k = EVar11;
  if (gc == (GCobj *)0x0) {
    if (bVar4) {
      uVar14 = 3;
      if (2 < uVar18) {
        uVar10 = 0x7ff;
        if (uVar18 < 0x7ff) {
          uVar10 = uVar18;
        }
        uVar14 = (ushort)uVar10;
      }
    }
    else {
      uVar14 = 0;
    }
    if (uVar17 != 0) {
      if (uVar17 == 1) {
        uVar17 = 0x800;
      }
      else {
        uVar18 = 0x1f;
        if (uVar17 - 1 != 0) {
          for (; uVar17 - 1 >> uVar18 == 0; uVar18 = uVar18 - 1) {
          }
        }
        uVar17 = (uVar18 ^ 0x1f) * -0x800 + 0x10000;
      }
    }
    *(ushort *)((long)&fs->bcbase[BVar6].ins + 2) = (ushort)uVar17 | uVar14;
  }
  else {
    if ((bVar4) && ((gc->pt).sizekgc < uVar18)) {
      lj_tab_reasize(fs->L,&gc->tab,uVar18 - 1);
    }
    if (bVar5) {
      pTVar13 = (gc->th).top;
      MVar1 = (gc->pt).sizekn;
      lVar16 = 0;
      do {
        if ((*(ulong *)((long)pTVar13 + lVar16) & 0xffff800000000000) == 0xfffa000000000000) {
          *(undefined8 *)((long)pTVar13 + lVar16) = 0xffffffffffffffff;
        }
        lVar16 = lVar16 + 0x18;
      } while ((ulong)(MVar1 + 1 + (uint)(MVar1 == 0xffffffff)) * 0x18 != lVar16);
    }
    uVar2 = (fs->L->glref).ptr64;
    if (*(ulong *)(uVar2 + 0x18) <= *(ulong *)(uVar2 + 0x10)) {
      lj_gc_step(fs->L);
    }
  }
  return;
}

Assistant:

static void expr_table(LexState *ls, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  BCLine line = ls->linenumber;
  GCtab *t = NULL;
  int vcall = 0, needarr = 0, fixt = 0;
  uint32_t narr = 1;  /* First array index. */
  uint32_t nhash = 0;  /* Number of hash entries. */
  BCReg freg = fs->freereg;
  BCPos pc = bcemit_AD(fs, BC_TNEW, freg, 0);
  expr_init(e, VNONRELOC, freg);
  bcreg_reserve(fs, 1);
  freg++;
  lex_check(ls, '{');
  while (ls->tok != '}') {
    ExpDesc key, val;
    vcall = 0;
    if (ls->tok == '[') {
      expr_bracket(ls, &key);  /* Already calls expr_toval. */
      if (!expr_isk(&key)) expr_index(fs, e, &key);
      if (expr_isnumk(&key) && expr_numiszero(&key)) needarr = 1; else nhash++;
      lex_check(ls, '=');
    } else if ((ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) &&
	       lj_lex_lookahead(ls) == '=') {
      expr_str(ls, &key);
      lex_check(ls, '=');
      nhash++;
    } else {
      expr_init(&key, VKNUM, 0);
      setintV(&key.u.nval, (int)narr);
      narr++;
      needarr = vcall = 1;
    }
    expr(ls, &val);
    if (expr_isk(&key) && key.k != VKNIL &&
	(key.k == VKSTR || expr_isk_nojump(&val))) {
      TValue k, *v;
      if (!t) {  /* Create template table on demand. */
	BCReg kidx;
	t = lj_tab_new(fs->L, needarr ? narr : 0, hsize2hbits(nhash));
	kidx = const_gc(fs, obj2gco(t), LJ_TTAB);
	fs->bcbase[pc].ins = BCINS_AD(BC_TDUP, freg-1, kidx);
      }
      vcall = 0;
      expr_kvalue(fs, &k, &key);
      v = lj_tab_set(fs->L, t, &k);
      lj_gc_anybarriert(fs->L, t);
      if (expr_isk_nojump(&val)) {  /* Add const key/value to template table. */
	expr_kvalue(fs, v, &val);
      } else {  /* Otherwise create dummy string key (avoids lj_tab_newkey). */
	settabV(fs->L, v, t);  /* Preserve key with table itself as value. */
	fixt = 1;   /* Fix this later, after all resizes. */
	goto nonconst;
      }
    } else {
    nonconst:
      if (val.k != VCALL) { expr_toanyreg(fs, &val); vcall = 0; }
      if (expr_isk(&key)) expr_index(fs, e, &key);
      bcemit_store(fs, e, &val);
    }
    fs->freereg = freg;
    if (!lex_opt(ls, ',') && !lex_opt(ls, ';')) break;
  }
  lex_match(ls, '}', '{', line);
  if (vcall) {
    BCInsLine *ilp = &fs->bcbase[fs->pc-1];
    ExpDesc en;
    lj_assertFS(bc_a(ilp->ins) == freg &&
		bc_op(ilp->ins) == (narr > 256 ? BC_TSETV : BC_TSETB),
		"bad CALL code generation");
    expr_init(&en, VKNUM, 0);
    en.u.nval.u32.lo = narr-1;
    en.u.nval.u32.hi = 0x43300000;  /* Biased integer to avoid denormals. */
    if (narr > 256) { fs->pc--; ilp--; }
    ilp->ins = BCINS_AD(BC_TSETM, freg, const_num(fs, &en));
    setbc_b(&ilp[-1].ins, 0);
  }
  if (pc == fs->pc-1) {  /* Make expr relocable if possible. */
    e->u.s.info = pc;
    fs->freereg--;
    e->k = VRELOCABLE;
  } else {
    e->k = VNONRELOC;  /* May have been changed by expr_index. */
  }
  if (!t) {  /* Construct TNEW RD: hhhhhaaaaaaaaaaa. */
    BCIns *ip = &fs->bcbase[pc].ins;
    if (!needarr) narr = 0;
    else if (narr < 3) narr = 3;
    else if (narr > 0x7ff) narr = 0x7ff;
    setbc_d(ip, narr|(hsize2hbits(nhash)<<11));
  } else {
    if (needarr && t->asize < narr)
      lj_tab_reasize(fs->L, t, narr-1);
    if (fixt) {  /* Fix value for dummy keys in template table. */
      Node *node = noderef(t->node);
      uint32_t i, hmask = t->hmask;
      for (i = 0; i <= hmask; i++) {
	Node *n = &node[i];
	if (tvistab(&n->val)) {
	  lj_assertFS(tabV(&n->val) == t, "bad dummy key in template table");
	  setnilV(&n->val);  /* Turn value into nil. */
	}
      }
    }
    lj_gc_check(fs->L);
  }
}